

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O1

void __thiscall chrono::ChMarker::ChMarker(ChMarker *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ChFunction *__tmp;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_50 [24];
  double local_38;
  
  ChObj::ChObj(&this->super_ChObj);
  local_58 = 0.0;
  local_68 = ZEXT816(0);
  local_50._0_8_ = 1.0;
  local_50._8_16_ = ZEXT816(0);
  local_38 = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&this->super_ChFrameMoving<double>,(ChVector<double> *)local_68,
             (ChQuaternion<double> *)local_50);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChMarker_00b2b038;
  (this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChMarker_00b2b078;
  this->motion_type = M_MOTION_FUNCTIONS;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_axis).m_data[0] = VECT_Z;
  (this->motion_axis).m_data[1] = DAT_00b90b08;
  (this->motion_axis).m_data[2] = DAT_00b90b10;
  this->Body = (ChBody *)0x0;
  dVar2 = CSYSNORM;
  (this->rest_coord).pos.m_data[0] = CSYSNORM;
  dVar3 = DAT_00b90b60;
  (this->rest_coord).pos.m_data[1] = DAT_00b90b60;
  dVar4 = DAT_00b90b68;
  (this->rest_coord).pos.m_data[2] = DAT_00b90b68;
  dVar5 = DAT_00b90b70;
  (this->rest_coord).rot.m_data[0] = DAT_00b90b70;
  dVar6 = DAT_00b90b78;
  (this->rest_coord).rot.m_data[1] = DAT_00b90b78;
  dVar7 = DAT_00b90b80;
  (this->rest_coord).rot.m_data[2] = DAT_00b90b80;
  dVar8 = DAT_00b90b88;
  (this->rest_coord).rot.m_data[3] = DAT_00b90b88;
  (this->last_rel_coord).pos.m_data[0] = dVar2;
  (this->last_rel_coord).pos.m_data[1] = dVar3;
  (this->last_rel_coord).pos.m_data[2] = dVar4;
  (this->last_rel_coord).rot.m_data[0] = dVar5;
  (this->last_rel_coord).rot.m_data[1] = dVar6;
  (this->last_rel_coord).rot.m_data[2] = dVar7;
  (this->last_rel_coord).rot.m_data[3] = dVar8;
  (this->last_rel_coord_dt).pos.m_data[0] = CSYSNULL;
  (this->last_rel_coord_dt).pos.m_data[1] = DAT_00b90b28;
  (this->last_rel_coord_dt).pos.m_data[2] = DAT_00b90b30;
  (this->last_rel_coord_dt).rot.m_data[0] = DAT_00b90b38;
  (this->last_rel_coord_dt).rot.m_data[1] = DAT_00b90b40;
  (this->last_rel_coord_dt).rot.m_data[2] = DAT_00b90b48;
  (this->last_rel_coord_dt).rot.m_data[3] = DAT_00b90b50;
  this->last_time = 0.0;
  local_58 = 0.0;
  local_68 = ZEXT816(0) << 0x20;
  local_50._0_8_ = 1.0;
  local_38 = 0.0;
  local_50._8_16_ = local_68;
  ChFrameMoving<double>::ChFrameMoving
            (&this->abs_frame,(ChVector<double> *)local_68,(ChQuaternion<double> *)local_50);
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var9[1]._M_use_count = 0;
  p_Var9[1]._M_weak_count = 0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  p_Var1 = (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var9;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var9[1]._M_use_count = 0;
  p_Var9[1]._M_weak_count = 0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  p_Var1 = (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var9;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var9[1]._M_use_count = 0;
  p_Var9[1]._M_weak_count = 0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  p_Var1 = (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var9;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var9[1]._M_use_count = 0;
  p_Var9[1]._M_weak_count = 0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  p_Var1 = (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var9;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (this->Body != (ChBody *)0x0) {
    ChFrameMoving<double>::TransformLocalToParent
              (&(this->Body->super_ChBodyFrame).super_ChFrameMoving<double>,
               &this->super_ChFrameMoving<double>,&this->abs_frame);
  }
  return;
}

Assistant:

ChMarker::ChMarker()
    : Body(NULL),
      rest_coord(CSYSNORM),
      motion_type(M_MOTION_FUNCTIONS),
      motion_axis(VECT_Z),
      last_rel_coord(CSYSNORM),
      last_rel_coord_dt(CSYSNULL),
      last_time(0) {
    motion_X = chrono_types::make_shared<ChFunction_Const>(0);  // default: no motion
    motion_Y = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_Z = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_ang = chrono_types::make_shared<ChFunction_Const>(0); 

    UpdateState();
}